

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall
cs::compiler_type::preprocessor::new_empty_line(preprocessor *this,context_t *context)

{
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::emplace_back<>(&((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->file_buff);
  this->empty_line = true;
  this->line_num = this->line_num + 1;
  return;
}

Assistant:

void new_empty_line(const context_t &context)
		{
			context->file_buff.emplace_back();
			empty_line = true;
			++line_num;
		}